

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StridedArrayView.h
# Opt level: O0

ElementType __thiscall
Corrade::Containers::StridedArrayView<1U,_const_Corrade::Containers::BasicStringView<const_char>_>::
operator[](StridedArrayView<1U,_const_Corrade::Containers::BasicStringView<const_char>_> *this,
          size_t i)

{
  undefined8 uVar1;
  Debug *pDVar2;
  BasicStringView<const_char> *pBVar3;
  EnumSet<Corrade::Utility::Debug::Flag,_(unsigned_char)__xff_> local_41;
  Error local_40 [40];
  size_t local_18;
  size_t i_local;
  StridedArrayView<1U,_const_Corrade::Containers::BasicStringView<const_char>_> *this_local;
  
  local_18 = i;
  i_local = (size_t)this;
  if ((this->_size)._data[0] <= i) {
    uVar1 = Corrade::Utility::Error::defaultOutput();
    EnumSet<Corrade::Utility::Debug::Flag,_(unsigned_char)'\xff'>::EnumSet(&local_41);
    Corrade::Utility::Error::Error(local_40,uVar1,local_41._value);
    pDVar2 = (Debug *)Corrade::Utility::Debug::operator<<
                                ((Debug *)local_40,
                                 "Containers::StridedArrayView::operator[](): index");
    pDVar2 = (Debug *)Corrade::Utility::Debug::operator<<(pDVar2,local_18);
    pDVar2 = (Debug *)Corrade::Utility::Debug::operator<<(pDVar2,"out of range for");
    pDVar2 = (Debug *)Corrade::Utility::Debug::operator<<(pDVar2,(this->_size)._data[0]);
    Corrade::Utility::Debug::operator<<(pDVar2,"elements");
    Corrade::Utility::Error::~Error(local_40);
    abort();
  }
  pBVar3 = Implementation::
           StridedElement<1U,_const_Corrade::Containers::BasicStringView<const_char>_>::get
                     (this->_data,&this->_size,&this->_stride,i);
  return pBVar3;
}

Assistant:

auto StridedArrayView<dimensions, T>::operator[](const std::size_t i) const -> ElementType {
    CORRADE_DEBUG_ASSERT(i < _size._data[0], "Containers::StridedArrayView::operator[](): index" << i << "out of range for" << _size._data[0] << "elements", (Implementation::StridedElement<dimensions, T>::get(_data, _size, _stride, i)));
    return Implementation::StridedElement<dimensions, T>::get(_data, _size, _stride, i);
}